

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_data_writer.cpp
# Opt level: O2

unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true> __thiscall
duckdb::SingleFileTableDataWriter::GetRowGroupWriter
          (SingleFileTableDataWriter *this,RowGroup *row_group)

{
  _func_int **in_RAX;
  _func_int **local_18;
  
  local_18 = in_RAX;
  make_uniq<duckdb::SingleFileRowGroupWriter,duckdb::DuckTableEntry&,duckdb::PartialBlockManager&,duckdb::SingleFileTableDataWriter&,duckdb::MetadataWriter&>
            ((duckdb *)&local_18,
             (DuckTableEntry *)
             (row_group->super_SegmentBase<duckdb::RowGroup>).count.
             super___atomic_base<unsigned_long>._M_i,
             (PartialBlockManager *)
             &((row_group->owned_version_info).internal.
               super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              start,(SingleFileTableDataWriter *)row_group,
             (MetadataWriter *)
             (row_group->owned_version_info).internal.
             super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  (this->super_TableDataWriter)._vptr_TableDataWriter = local_18;
  return (unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>)
         (unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>)this;
}

Assistant:

unique_ptr<RowGroupWriter> SingleFileTableDataWriter::GetRowGroupWriter(RowGroup &row_group) {
	return make_uniq<SingleFileRowGroupWriter>(table, checkpoint_manager.partial_block_manager, *this,
	                                           table_data_writer);
}